

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_class_decl(gvisitor_t *self,gnode_class_decl_t *node)

{
  gravity_class_t *superclass;
  gravity_class_t *baseclass;
  gnode_t *pgVar1;
  char *identifier;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  size_t sVar7;
  size_t _i;
  ulong uVar8;
  
  if (node->storage != TOK_KEY_EXTERN) {
    baseclass = gravity_class_new_pair
                          (*(gravity_vm **)((long)self->data + 0x38),node->identifier,
                           (gravity_class_t *)0x0,node->nivar,node->nsvar);
    baseclass->is_struct = node->is_struct;
    pgVar1 = node->superclass;
    if (pgVar1 != (gnode_t *)0x0) {
      if (pgVar1->tag == NODE_CLASS_DECL) {
        node->super_extern = pgVar1[1].token.lineno == 0x1f;
      }
      else {
        pgVar1 = gnode2class(pgVar1,&node->super_extern);
        node->superclass = pgVar1;
        if (pgVar1 == (gnode_t *)0x0) {
          report_error(self,&node->base,"Unable to set superclass to non class object.");
        }
      }
      if (node->super_extern == true) {
        identifier = gnode_identifier(node->superclass);
        gravity_class_setsuper_extern(baseclass,identifier);
      }
      else {
        superclass = *(gravity_class_t **)(node->superclass + 2);
        if (superclass == (gravity_class_t *)0x0) {
          pvVar3 = self->data;
          node->data = baseclass;
          lVar4 = *(long *)((long)pvVar3 + 0x18);
          if (lVar4 == *(long *)((long)pvVar3 + 0x20)) {
            lVar6 = lVar4 * 2;
            if (lVar4 == 0) {
              lVar6 = 8;
            }
            *(long *)((long)pvVar3 + 0x20) = lVar6;
            pvVar2 = realloc(*(void **)((long)pvVar3 + 0x28),lVar6 << 3);
            *(void **)((long)pvVar3 + 0x28) = pvVar2;
            lVar4 = *(long *)((long)pvVar3 + 0x18);
          }
          else {
            pvVar2 = *(void **)((long)pvVar3 + 0x28);
          }
          *(long *)((long)pvVar3 + 0x18) = lVar4 + 1;
          *(gnode_class_decl_t **)((long)pvVar2 + lVar4 * 8) = node;
        }
        else {
          gravity_class_setsuper(baseclass,superclass);
        }
      }
    }
    plVar5 = (long *)self->data;
    lVar4 = *plVar5;
    if (lVar4 == plVar5[1]) {
      lVar6 = lVar4 * 2;
      if (lVar4 == 0) {
        lVar6 = 8;
      }
      plVar5[1] = lVar6;
      pvVar3 = realloc((void *)plVar5[2],lVar6 << 3);
      plVar5 = (long *)self->data;
      plVar5[2] = (long)pvVar3;
      lVar4 = *plVar5;
    }
    else {
      pvVar3 = (void *)plVar5[2];
    }
    *plVar5 = lVar4 + 1;
    *(gravity_class_t **)((long)pvVar3 + lVar4 * 8) = baseclass;
    if (node->decls == (gnode_r *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = node->decls->n;
    }
    for (uVar8 = 0; sVar7 != uVar8; uVar8 = uVar8 + 1) {
      if (uVar8 < node->decls->n) {
        pgVar1 = node->decls->p[uVar8];
      }
      else {
        pgVar1 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar1);
    }
    *(long *)self->data = *self->data + -1;
    process_constructor(self,baseclass,&node->base);
    store_declaration(self,baseclass,node->storage == TOK_KEY_STATIC,(gnode_function_decl_t *)0x0);
    node->data = baseclass;
  }
  return;
}

Assistant:

static void visit_class_decl (gvisitor_t *self, gnode_class_decl_t *node) {
    DEBUG_CODEGEN("visit_class_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    // create a new pair of classes (class itself and its meta)
    gravity_class_t *c = gravity_class_new_pair(GET_VM(), node->identifier, NULL, node->nivar, node->nsvar);

    // mark the class as a struct
    c->is_struct = node->is_struct;
    
    // check if class has a declared superclass
    if (node->superclass) {
        // node->superclass should be a gnode_class_decl_t at this point
        if (NODE_ISA_CLASS(node->superclass)) {
            node->super_extern = (((gnode_class_decl_t *)node->superclass)->storage == TOK_KEY_EXTERN);
        } else {
            node->superclass = gnode2class((gnode_t*)node->superclass, &node->super_extern);
            if (!node->superclass) report_error(self, (gnode_t*)node, "Unable to set superclass to non class object.");
        }
        
        if (node->super_extern) {
            gravity_class_setsuper_extern(c, gnode_identifier((gnode_t*)node->superclass));
        } else {
            gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;
            if (super->data) {
                // means that superclass has already been processed and its runtime representation is available
                gravity_class_setsuper(c, (gravity_class_t *)super->data);
            } else {
                // superclass has not yet processed so we need recheck the node at the end of the visit
                // add node to superfix for later processing
                codegen_t *data = (codegen_t *)self->data;
                node->data = (void *)c;
                marray_push(gnode_class_decl_t *, data->superfix, node);
            }
        }
    }

    CONTEXT_PUSH(c);

    // process inner declarations
    gnode_array_each(node->decls, {visit(val);});

    // adjust declaration stack
    CONTEXT_POP();

    // fix constructor chain
    process_constructor(self, c, (gnode_t *)node);

    // store class declaration in current context
    store_declaration(self, (gravity_object_t *)c, (node->storage == TOK_KEY_STATIC), NULL);

    // save runtime representation
    // since this class could be a superclass of another class
    // then save opaque gravity_class_t pointer to node->data
    node->data = (void *)c;
}